

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analysis.cc
# Opt level: O0

void __thiscall gimage::Histogram::visualize(Histogram *this,ImageU8 *image)

{
  unsigned_long *puVar1;
  unsigned_long in_RSI;
  ImageU8 *in_RDI;
  Histogram *unaff_retaddr;
  int i;
  int k;
  unsigned_long maxval;
  int local_20;
  int local_1c;
  unsigned_long local_18;
  ImageU8 *image_00;
  
  local_18 = 1;
  image_00 = in_RDI;
  for (local_1c = 0; local_1c < *(int *)&in_RDI->field_0x4; local_1c = local_1c + 1) {
    for (local_20 = 0; local_20 < in_RDI->depth; local_20 = local_20 + 1) {
      puVar1 = std::max<unsigned_long>
                         (&local_18,
                          (unsigned_long *)
                          (*(long *)(in_RDI->n + (long)local_1c * 8) + (long)local_20 * 8));
      local_18 = *puVar1;
    }
  }
  visualize(unaff_retaddr,image_00,in_RSI);
  return;
}

Assistant:

void Histogram::visualize(ImageU8 &image) const
{
  unsigned long maxval=1;

  for (int k=0; k<h; k++)
  {
    for (int i=0; i<w; i++)
    {
      maxval=std::max(maxval, row[k][i]);
    }
  }

  visualize(image, maxval);
}